

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits(RandomMixin<FastRandomContext> *this,int bits)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bits == 0x40) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      uVar2 = FastRandomContext::rand64((FastRandomContext *)this);
      return uVar2;
    }
  }
  else {
    iVar6 = this->bitbuf_size;
    bVar4 = (byte)bits;
    if (iVar6 < bits) {
      uVar2 = FastRandomContext::rand64((FastRandomContext *)this);
      bVar5 = (byte)this->bitbuf_size;
      uVar7 = uVar2 >> (bVar4 - bVar5 & 0x3f);
      uVar3 = uVar2 << (bVar5 & 0x3f) | this->bitbuf;
      iVar6 = this->bitbuf_size + 0x40;
    }
    else {
      uVar3 = this->bitbuf;
      uVar7 = uVar3 >> (bVar4 & 0x3f);
    }
    this->bitbuf = uVar7;
    this->bitbuf_size = iVar6 - bits;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return uVar3 & ~(-1L << (bVar4 & 0x3f));
    }
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits(int bits) noexcept
    {
        Assume(bits <= 64);
        // Requests for the full 64 bits are passed through.
        if (bits == 64) return Impl().rand64();
        uint64_t ret;
        if (bits <= bitbuf_size) {
            // If there is enough entropy left in bitbuf, return its bottom bits bits.
            ret = bitbuf;
            bitbuf >>= bits;
            bitbuf_size -= bits;
        } else {
            // If not, return all of bitbuf, supplemented with the (bits - bitbuf_size) bottom
            // bits of a newly generated 64-bit number on top. The remainder of that generated
            // number becomes the new bitbuf.
            uint64_t gen = Impl().rand64();
            ret = (gen << bitbuf_size) | bitbuf;
            bitbuf = gen >> (bits - bitbuf_size);
            bitbuf_size = 64 + bitbuf_size - bits;
        }
        // Return the bottom bits bits of ret.
        return ret & ((uint64_t{1} << bits) - 1);
    }